

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

CTcSymbol * __thiscall
CVmDynFuncSymtab::find_local(CVmDynFuncSymtab *this,textchar_t *sym,size_t len)

{
  uint uVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  CTcSymbol *pCVar4;
  vm_obj_id_t vVar5;
  bool bVar6;
  vm_val_t ele;
  vm_val_t lt;
  vm_val_t local_60;
  vm_val_t local_50;
  vm_val_t local_40;
  
  uVar1 = this->locals_;
  if (uVar1 != 0) {
    iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),
                       CVmObjFrameDesc::metaclass_reg_);
    if (iVar2 != 0) {
      pCVar4 = find_local(this,sym,len,this->locals_);
      return pCVar4;
    }
    local_40.val.obj = this->locals_;
    local_40.typ = VM_OBJ;
    vVar3 = vm_val_t::ll_length(&local_40);
    if (0 < (int)vVar3) {
      vVar5 = 1;
      do {
        local_50.typ = VM_INT;
        local_50.val.obj = vVar5;
        vm_val_t::ll_index(&local_40,&local_60,&local_50);
        if (((local_60.typ == VM_OBJ) &&
            (iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[local_60.val.obj >> 0xc]
                                            [local_60.val.obj & 0xfff].ptr_ + 8))
                               (G_obj_table_X.pages_[local_60.val.obj >> 0xc] +
                                (local_60.val.obj & 0xfff),CVmObjFrameDesc::metaclass_reg_),
            iVar2 != 0)) &&
           (pCVar4 = find_local(this,sym,len,local_60.val.obj), pCVar4 != (CTcSymbol *)0x0)) {
          return pCVar4;
        }
        bVar6 = vVar5 != vVar3;
        vVar5 = vVar5 + 1;
      } while (bVar6);
    }
  }
  return (CTcSymbol *)0x0;
}

Assistant:

CTcSymbol *find_local(const textchar_t *sym, size_t len)
    {
        /* if there's no user-code table, there's nothing to search */
        if (locals_ == VM_INVALID_OBJ)
            return 0;

        /* establish access to globals */
        VMGLOB_PTR(gptr_);

        /* 
         *   if it's a StackFrameDesc object, look up the symbol; otherwise
         *   try to treat it as a list-like object, and check each element of
         *   the list 
         */
        if (CVmObjFrameDesc::is_framedesc_obj(vmg_ locals_))
        {
            /* look up the value in our single table */
            return find_local(sym, len, locals_);
        }
        else
        {
            /* assume it's a list - set up an object value */
            vm_val_t lt;
            lt.set_obj(locals_);
            
            /* check each list element */
            int n = lt.ll_length(vmg0_);
            for (int i = 1 ; i <= n ; ++i)
            {
                /* get this element */
                vm_val_t ele;
                lt.ll_index(vmg_ &ele, i);

                /* if it's a StackFrameDesc object, check it */
                if (ele.typ == VM_OBJ
                    && CVmObjFrameDesc::is_framedesc_obj(vmg_ ele.val.obj))
                {
                    /* look up the value in this table */
                    CTcSymbol *ret = find_local(sym, len, ele.val.obj);

                    /* if we found it, return the value */
                    if (ret != 0)
                        return ret;
                }
            }

            /* we didn't find a value */
            return 0;
        }